

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O1

void __thiscall t_perl_generator::generate_service_rest(t_perl_generator *this,t_service *tservice)

{
  ofstream_with_content_based_conditional_update *os;
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  t_service *ptVar3;
  long lVar4;
  int iVar5;
  long *plVar6;
  undefined4 extraout_var;
  ostream *poVar7;
  t_type *ptVar8;
  undefined8 *puVar9;
  size_type *psVar10;
  _Alloc_hider _Var11;
  t_perl_generator *this_00;
  char *__end;
  string req;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string extends_if;
  string extends;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  char *local_78;
  long local_70;
  char local_68 [16];
  long *local_58;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"","");
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"","");
  ptVar3 = tservice->extends_;
  if (ptVar3 != (t_service *)0x0) {
    (*(ptVar3->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar3);
    std::__cxx11::string::_M_assign((string *)&local_50);
    perl_namespace_abi_cxx11_(&local_98,this,(ptVar3->super_t_type).program_);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x3a030a);
    psVar10 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_b8.field_2._M_allocated_capacity = *psVar10;
      local_b8.field_2._8_4_ = (undefined4)plVar6[3];
      local_b8.field_2._12_4_ = *(undefined4 *)((long)plVar6 + 0x1c);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    }
    else {
      local_b8.field_2._M_allocated_capacity = *psVar10;
      local_b8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_b8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    iVar5 = (*(ptVar3->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar3);
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_b8,*(ulong *)CONCAT44(extraout_var,iVar5));
    psVar10 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_d8.field_2._M_allocated_capacity = *psVar10;
      local_d8.field_2._8_8_ = plVar6[3];
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    }
    else {
      local_d8.field_2._M_allocated_capacity = *psVar10;
      local_d8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_d8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_d8);
    psVar10 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_f8.field_2._M_allocated_capacity = *psVar10;
      local_f8.field_2._8_8_ = plVar6[3];
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    }
    else {
      local_f8.field_2._M_allocated_capacity = *psVar10;
      local_f8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_f8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_78,(string *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
  }
  os = &this->f_service_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,"package ",8);
  perl_namespace_abi_cxx11_(&local_f8,this,(this->super_t_oop_generator).super_t_generator.program_)
  ;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)os,local_f8._M_dataplus._M_p,local_f8._M_string_length);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(this->super_t_oop_generator).super_t_generator.service_name_.
                             _M_dataplus._M_p,
                      (this->super_t_oop_generator).super_t_generator.service_name_._M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Rest;",5);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"use strict;",0xb);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_78,local_70);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if (local_48 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,"sub new {",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)os,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&local_f8,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)os,local_f8._M_dataplus._M_p,local_f8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"my ($classname, $impl) = @_;",0x1c);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_d8,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_d8._M_dataplus._M_p,local_d8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"my $self     ={ impl => $impl };",0x20);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_b8,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_b8._M_dataplus._M_p,local_b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"return bless($self,$classname);",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,"}",1);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)os,::endl_abi_cxx11_._M_dataplus._M_p,
                        ::endl_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&local_98,&tservice->functions_)
  ;
  if (local_98._M_dataplus._M_p != (pointer)local_98._M_string_length) {
    paVar2 = &local_d8.field_2;
    _Var11._M_p = local_98._M_dataplus._M_p;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,"sub ",4);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)os,*(char **)(*(long *)_Var11._M_p + 0x68),
                          *(long *)(*(long *)_Var11._M_p + 0x70));
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"{",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      t_generator::indent_abi_cxx11_(&local_f8,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)os,local_f8._M_dataplus._M_p,local_f8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"my ($self, $request) = @_;",0x1a);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      lVar4 = *(long *)(*(long *)_Var11._M_p + 0x88);
      local_58 = (long *)_Var11._M_p;
      for (plVar6 = *(long **)(lVar4 + 0x88); plVar6 != *(long **)(lVar4 + 0x90);
          plVar6 = plVar6 + 1) {
        ptVar8 = t_type::get_true_type(*(t_type **)(*plVar6 + 0x60));
        std::operator+(&local_d8,"$request->{\'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*plVar6 + 0x68));
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
        psVar10 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_f8.field_2._M_allocated_capacity = *psVar10;
          local_f8.field_2._8_8_ = puVar9[3];
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        }
        else {
          local_f8.field_2._M_allocated_capacity = *psVar10;
          local_f8._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_f8._M_string_length = puVar9[1];
        *puVar9 = psVar10;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        t_generator::indent_abi_cxx11_(&local_d8,(t_generator *)this);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)os,local_d8._M_dataplus._M_p,local_d8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"my $",4);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,*(char **)(*plVar6 + 0x68),*(long *)(*plVar6 + 0x70));
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," = (",4);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_f8._M_dataplus._M_p,local_f8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ? ",4);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_f8._M_dataplus._M_p,local_f8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," : undef;",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        iVar5 = (*(ptVar8->super_t_doc)._vptr_t_doc[6])(ptVar8);
        if ((((char)iVar5 != '\0') &&
            (*(char *)((long)&ptVar8[1].super_t_doc._vptr_t_doc + 4) == '\x01')) &&
           (*(int *)&ptVar8[1].super_t_doc._vptr_t_doc == 1)) {
          t_generator::indent_abi_cxx11_(&local_d8,(t_generator *)this);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)os,local_d8._M_dataplus._M_p,local_d8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"my @",4);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,*(char **)(*plVar6 + 0x68),*(long *)(*plVar6 + 0x70));
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," = split(/,/, $",0xf);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,*(char **)(*plVar6 + 0x68),*(long *)(*plVar6 + 0x70));
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,");",2);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                              ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_(&local_b8,(t_generator *)this);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_b8._M_dataplus._M_p,local_b8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"$",1);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,*(char **)(*plVar6 + 0x68),*(long *)(*plVar6 + 0x70));
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," = \\@",5);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,*(char **)(*plVar6 + 0x68),*(long *)(*plVar6 + 0x70));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != paVar2) {
            operator_delete(local_d8._M_dataplus._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p);
        }
      }
      t_generator::indent_abi_cxx11_(&local_f8,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)os,local_f8._M_dataplus._M_p,local_f8._M_string_length);
      plVar6 = local_58;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"return $self->{impl}->",0x16);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,*(char **)(*plVar6 + 0x68),*(long *)(*plVar6 + 0x70));
      this_00 = (t_perl_generator *)0x3a1f75;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(",1);
      argument_list_abi_cxx11_(&local_d8,this_00,*(t_struct **)(*plVar6 + 0x88));
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_d8._M_dataplus._M_p,local_d8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,");",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      poVar7 = t_generator::indent((t_generator *)this,(ostream *)os);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      _Var11._M_p = (pointer)(plVar6 + 1);
    } while (_Var11._M_p != (pointer)local_98._M_string_length);
  }
  if ((long *)local_98._M_dataplus._M_p != (long *)0x0) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return;
}

Assistant:

void t_perl_generator::generate_service_rest(t_service* tservice) {
  string extends = "";
  string extends_if = "";
  t_service* extends_s = tservice->get_extends();
  if (extends_s != nullptr) {
    extends = extends_s->get_name();
    extends_if = "use base qw(" + perl_namespace(extends_s->get_program()) + extends_s->get_name()
                 + "Rest);";
  }
  f_service_ << "package " << perl_namespace(program_) << service_name_ << "Rest;" << endl << endl
             << "use strict;" << endl << extends_if << endl << endl;

  if (extends.empty()) {
    f_service_ << "sub new {" << endl;

    indent_up();

    f_service_ << indent() << "my ($classname, $impl) = @_;" << endl << indent()
               << "my $self     ={ impl => $impl };" << endl << endl << indent()
               << "return bless($self,$classname);" << endl;

    indent_down();

    f_service_ << "}" << endl << endl;
  }

  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    f_service_ << "sub " << (*f_iter)->get_name() << "{" << endl;

    indent_up();

    f_service_ << indent() << "my ($self, $request) = @_;" << endl << endl;

    const vector<t_field*>& args = (*f_iter)->get_arglist()->get_members();
    vector<t_field*>::const_iterator a_iter;
    for (a_iter = args.begin(); a_iter != args.end(); ++a_iter) {
      t_type* atype = get_true_type((*a_iter)->get_type());
      string req = "$request->{'" + (*a_iter)->get_name() + "'}";
      f_service_ << indent() << "my $" << (*a_iter)->get_name() << " = (" << req << ") ? " << req
                 << " : undef;" << endl;
      if (atype->is_string() && ((t_base_type*)atype)->is_string_list()) {
        f_service_ << indent() << "my @" << (*a_iter)->get_name() << " = split(/,/, $"
                   << (*a_iter)->get_name() << ");" << endl << indent() << "$"
                   << (*a_iter)->get_name() << " = \\@" << (*a_iter)->get_name() << endl;
      }
    }
    f_service_ << indent() << "return $self->{impl}->" << (*f_iter)->get_name() << "("
               << argument_list((*f_iter)->get_arglist()) << ");" << endl;
    indent_down();
    indent(f_service_) << "}" << endl << endl;
  }
}